

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_interface.cpp
# Opt level: O1

bool __thiscall
RuntimeInterface::TrackDebugMessenger
          (RuntimeInterface *this,XrInstance instance,XrDebugUtilsMessengerEXT messenger)

{
  int iVar1;
  mapped_type *ppXVar2;
  XrDebugUtilsMessengerEXT local_20;
  
  local_20 = messenger;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->_messenger_to_instance_mutex);
  if (iVar1 == 0) {
    ppXVar2 = std::__detail::
              _Map_base<XrDebugUtilsMessengerEXT_T_*,_std::pair<XrDebugUtilsMessengerEXT_T_*const,_XrInstance_T_*>,_std::allocator<std::pair<XrDebugUtilsMessengerEXT_T_*const,_XrInstance_T_*>_>,_std::__detail::_Select1st,_std::equal_to<XrDebugUtilsMessengerEXT_T_*>,_std::hash<XrDebugUtilsMessengerEXT_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<XrDebugUtilsMessengerEXT_T_*,_std::pair<XrDebugUtilsMessengerEXT_T_*const,_XrInstance_T_*>,_std::allocator<std::pair<XrDebugUtilsMessengerEXT_T_*const,_XrInstance_T_*>_>,_std::__detail::_Select1st,_std::equal_to<XrDebugUtilsMessengerEXT_T_*>,_std::hash<XrDebugUtilsMessengerEXT_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->_messenger_to_instance_map,&local_20);
    *ppXVar2 = instance;
    pthread_mutex_unlock((pthread_mutex_t *)&this->_messenger_to_instance_mutex);
    return true;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

bool RuntimeInterface::TrackDebugMessenger(XrInstance instance, XrDebugUtilsMessengerEXT messenger) {
    std::lock_guard<std::mutex> mlock(_messenger_to_instance_mutex);
    _messenger_to_instance_map[messenger] = instance;
    return true;
}